

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::keyPressEvent(QMenu *this,QKeyEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar13;
  undefined4 uVar14;
  QMenuPrivate *this_00;
  QWidget *pQVar15;
  QArrayData *pQVar16;
  ushort *puVar17;
  QWidgetData *pQVar18;
  QRect *pQVar19;
  int *piVar20;
  bool bVar21;
  QAction *pQVar22;
  char cVar23;
  short sVar24;
  short sVar25;
  LayoutDirection LVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  QStyle *pQVar31;
  long lVar32;
  QAction *pQVar33;
  qsizetype qVar34;
  QObject *pQVar35;
  long lVar36;
  ulong uVar37;
  ScrollLocation SVar38;
  ScrollDirection direction;
  Representation RVar39;
  Data *pDVar40;
  QAction *pQVar41;
  ulong uVar42;
  long lVar43;
  long in_FS_OFFSET;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  QRect QVar55;
  QKeySequence sequence;
  QAction *local_90;
  int local_7c;
  QAction *local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  local_68 = (undefined1  [16])QMenuPrivate::popupGeometry(this_00,(QScreen *)0x0);
  QMenuPrivate::updateActionRects(this_00,(QRect *)local_68);
  iVar27 = *(int *)(e + 0x40);
  LVar26 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar26 != RightToLeft) {
    if (iVar27 < 0x1000023) {
      bVar44 = true;
      bVar21 = false;
      iVar53 = 0x1000015;
      switch(iVar27) {
      case 0x1000001:
        goto switchD_0045d7cc_caseD_1000001;
      case 0x1000002:
        goto switchD_0045d7cc_caseD_1000002;
      case 0x1000003:
      case 0x1000006:
      case 0x1000007:
      case 0x1000008:
      case 0x1000009:
      case 0x100000a:
      case 0x100000b:
      case 0x100000c:
      case 0x100000d:
      case 0x100000e:
      case 0x100000f:
        goto switchD_0045d7cc_caseD_1000003;
      case 0x1000004:
      case 0x1000005:
        goto switchD_0045d7cc_caseD_1000004;
      case 0x1000010:
        goto switchD_0045d7cc_caseD_1000010;
      case 0x1000011:
        goto switchD_0045d7cc_caseD_1000011;
      case 0x1000012:
        goto switchD_0045d7cc_caseD_1000014;
      case 0x1000013:
      case 0x1000015:
        goto switchD_0045d7cc_caseD_1000013;
      case 0x1000014:
        goto switchD_0045d7cc_caseD_1000012;
      case 0x1000016:
        goto switchD_0045d7cc_caseD_1000016;
      case 0x1000017:
        goto switchD_0045d7cc_caseD_1000017;
      default:
        goto switchD_0045d7cc_default;
      }
    }
LAB_0045d8a0:
    if (iVar27 == 0x1000023) {
      if ((this_00->field_0x421 & 4) == 0) {
        pQVar31 = QWidget::style(&this->super_QWidget);
        iVar27 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x12,0,this,0);
        if (iVar27 != 0) {
          QMenuPrivate::hideMenu(this_00,this);
          QApplication::focusWidget();
          lVar32 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
          if (lVar32 != 0) {
            QMenuBarPrivate::setKeyboardMode(*(QMenuBarPrivate **)(lVar32 + 8),false);
          }
        }
        goto LAB_0045e730;
      }
    }
    else if ((iVar27 == 0x1000030) && (this_00->currentAction != (QAction *)0x0)) {
      QAction::whatsThis();
      uVar7 = local_68._8_8_;
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      if (uVar7 != 0) {
        QWhatsThis::enterWhatsThisMode();
        QMenuPrivate::activateAction(this_00,this_00->currentAction,Trigger,true);
        goto LAB_0045e739;
      }
    }
    goto switchD_0045d7cc_caseD_1000003;
  }
  if (0x1000022 < iVar27) goto LAB_0045d8a0;
  bVar44 = true;
  bVar21 = false;
  iVar53 = 0x1000015;
  switch(iVar27) {
  case 0x1000002:
switchD_0045d7cc_caseD_1000002:
    pQVar33 = this_00->currentAction;
    iVar53 = 0x1000013;
    if (pQVar33 != (QAction *)0x0) goto LAB_0045da22;
    goto LAB_0045db6c;
  case 0x1000003:
  case 0x1000006:
  case 0x1000007:
  case 0x1000008:
  case 0x1000009:
  case 0x100000a:
  case 0x100000b:
  case 0x100000c:
  case 0x100000d:
  case 0x100000e:
  case 0x100000f:
    goto switchD_0045d7cc_caseD_1000003;
  case 0x1000004:
  case 0x1000005:
switchD_0045d7cc_caseD_1000004:
    if (this_00->currentAction == (QAction *)0x0) {
      QMenuPrivate::setFirstActionActive(this_00);
      break;
    }
    QMenuPrivate::setSyncAction(this_00);
    QAction::menuObject();
    lVar32 = QMetaObject::cast((QObject *)&staticMetaObject);
    local_90 = this_00->currentAction;
    if (lVar32 != 0) {
LAB_0045d999:
      QMenuPrivate::popupAction(this_00,local_90,0,true);
      break;
    }
    goto LAB_0045ddc3;
  case 0x1000010:
switchD_0045d7cc_caseD_1000010:
    if (this_00->scroll == (QMenuScroller *)0x0) break;
    goto LAB_0045dad8;
  case 0x1000011:
switchD_0045d7cc_caseD_1000011:
    if (this_00->scroll == (QMenuScroller *)0x0) break;
    goto LAB_0045daa6;
  case 0x1000012:
switchD_0045d7cc_caseD_1000012:
    bVar21 = true;
    if ((this_00->currentAction != (QAction *)0x0) &&
       (cVar23 = QAction::isEnabled(), cVar23 != '\0')) {
      QAction::menuObject();
      lVar32 = QMetaObject::cast((QObject *)&staticMetaObject);
      if (lVar32 != 0) {
        local_90 = this_00->currentAction;
        goto LAB_0045d999;
      }
    }
    bVar44 = false;
  case 0x1000014:
switchD_0045d7cc_caseD_1000014:
    if ((this_00->currentAction != (QAction *)0x0) && (this_00->scroll == (QMenuScroller *)0x0)) {
      QVar55 = QMenuPrivate::actionRect(this_00,this_00->currentAction);
      lVar32 = QVar55._0_8_ >> 0x20;
      lVar36 = QVar55._8_8_ >> 0x20;
      if (bVar44) {
        if (0 < QVar55.x1.m_i.m_i) {
          lVar36 = lVar36 + lVar32;
          uVar42 = (ulong)(QVar55.x1.m_i.m_i & 0x7fffffff);
          do {
            pQVar33 = QMenuPrivate::actionAt
                                (this_00,(QPoint)((lVar36 - (lVar36 >> 0x3f) & 0xfffffffffffffffeU)
                                                  * 0x80000000 + -1 + uVar42));
            if (pQVar33 != (QAction *)0x0) break;
            bVar44 = 1 < uVar42;
            uVar42 = uVar42 - 1;
          } while (bVar44);
          if (pQVar33 != (QAction *)0x0) goto LAB_0045e448;
        }
        goto LAB_0045dbff;
      }
      lVar36 = lVar36 + lVar32;
      RVar39 = QVar55.x2.m_i;
      do {
        RVar39.m_i = RVar39.m_i + 1;
        pQVar18 = (this->super_QWidget).data;
        if (((pQVar18->crect).x2.m_i - (pQVar18->crect).x1.m_i) + 1 <= RVar39.m_i)
        goto LAB_0045dbff;
        pQVar33 = QMenuPrivate::actionAt
                            (this_00,(QPoint)((ulong)(uint)RVar39.m_i |
                                             (lVar36 - (lVar36 >> 0x3f) & 0xfffffffffffffffeU) <<
                                             0x1f));
      } while (pQVar33 == (QAction *)0x0);
      goto LAB_0045e448;
    }
LAB_0045dbff:
    if ((bVar21) || (lVar32 = QMetaObject::cast((QObject *)&staticMetaObject), lVar32 == 0))
    goto switchD_0045d7cc_caseD_1000003;
    pDVar40 = (this_00->causedPopup).widget.wp.d;
    if (pDVar40 != (Data *)0x0) {
      pQVar15 = (QWidget *)(this_00->causedPopup).widget.wp.value;
      LOCK();
      *(int *)pDVar40 = *(int *)pDVar40 + 1;
      UNLOCK();
      QMenuPrivate::hideMenu(this_00,this);
      if (pQVar15 != (QWidget *)0x0 && *(int *)(pDVar40 + 4) != 0) {
        QWidget::setFocus(pQVar15,OtherFocusReason);
      }
      goto LAB_0045e20c;
    }
    QMenuPrivate::hideMenu(this_00,this);
    break;
  case 0x1000013:
  case 0x1000015:
switchD_0045d7cc_caseD_1000013:
    iVar53 = iVar27;
  case 0x1000001:
switchD_0045d7cc_caseD_1000001:
    pQVar33 = this_00->currentAction;
    if (pQVar33 == (QAction *)0x0) {
      if (iVar53 == 0x1000015) {
        uVar42 = (this_00->super_QWidgetPrivate).actions.d.size;
        if (uVar42 != 0) {
          lVar32 = 8;
          uVar37 = 0;
          do {
            pQVar19 = (this_00->actionRects).d.ptr;
            uVar7 = *(undefined8 *)((long)pQVar19 + lVar32 + -8);
            uVar8 = *(undefined8 *)((long)&(pQVar19->x1).m_i + lVar32);
            iVar27 = -(uint)((int)uVar8 == (int)uVar7 + -1);
            iVar53 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
            auVar45._4_4_ = iVar27;
            auVar45._0_4_ = iVar27;
            auVar45._8_4_ = iVar53;
            auVar45._12_4_ = iVar53;
            iVar27 = movmskpd((int)pQVar19,auVar45);
            if (iVar27 != 3) {
              pQVar33 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar37];
              bVar44 = QMenuPrivate::considerAction(this_00,pQVar33);
              if (bVar44) goto LAB_0045e224;
              uVar42 = (this_00->super_QWidgetPrivate).actions.d.size;
            }
            uVar37 = uVar37 + 1;
            lVar32 = lVar32 + 0x10;
          } while (uVar37 < uVar42);
        }
      }
      else {
LAB_0045db6c:
        uVar28 = (int)(this_00->super_QWidgetPrivate).actions.d.size - 1;
        if (-1 < (int)uVar28) {
          lVar36 = (ulong)uVar28 << 4;
          lVar32 = (ulong)uVar28 + 1;
          do {
            pQVar19 = (this_00->actionRects).d.ptr;
            uVar7 = *(undefined8 *)((long)&(pQVar19->x1).m_i + lVar36);
            uVar8 = *(undefined8 *)((long)&(pQVar19->x2).m_i + lVar36);
            iVar27 = -(uint)((int)uVar8 == (int)uVar7 + -1);
            iVar53 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
            auVar46._4_4_ = iVar27;
            auVar46._0_4_ = iVar27;
            auVar46._8_4_ = iVar53;
            auVar46._12_4_ = iVar53;
            iVar27 = movmskpd((int)pQVar19,auVar46);
            if (iVar27 != 3) {
              pQVar33 = (this_00->super_QWidgetPrivate).actions.d.ptr[lVar32 + -1];
              bVar44 = QMenuPrivate::considerAction(this_00,pQVar33);
              if (bVar44) goto LAB_0045e224;
            }
            lVar36 = lVar36 + -0x10;
            lVar43 = lVar32 + -1;
            bVar44 = 0 < lVar32;
            lVar32 = lVar43;
          } while (lVar43 != 0 && bVar44);
        }
      }
    }
    else {
LAB_0045da22:
      uVar42 = (this_00->super_QWidgetPrivate).actions.d.size;
      if (uVar42 != 0) {
        iVar27 = 0;
        lVar32 = 0xc;
        uVar37 = 0;
        do {
          if ((this_00->super_QWidgetPrivate).actions.d.ptr[uVar37] == pQVar33) {
            if (iVar53 == 0x1000013) {
              SVar38 = ScrollStay;
              goto LAB_0045dc43;
            }
            pQVar19 = (this_00->actionRects).d.ptr;
            iVar53 = *(int *)((long)&(pQVar19->x1).m_i + lVar32);
            iVar54 = *(int *)((long)pQVar19 + lVar32 + -8);
            SVar38 = ScrollStay;
            goto LAB_0045e015;
          }
          pQVar19 = (this_00->actionRects).d.ptr;
          iVar27 = ((iVar27 + *(int *)((long)&(pQVar19->x1).m_i + lVar32)) -
                   *(int *)((long)pQVar19 + lVar32 + -8)) + 1;
          uVar37 = uVar37 + 1;
          lVar32 = lVar32 + 0x10;
        } while (uVar37 < uVar42);
      }
    }
    break;
  case 0x1000016:
switchD_0045d7cc_caseD_1000016:
    if ((this_00->currentAction == (QAction *)0x0) || (this_00->scroll == (QMenuScroller *)0x0))
    break;
    if ((this_00->scroll->scrollFlags & 1) != 0) {
      direction = ScrollUp;
LAB_0045e46e:
      QMenuPrivate::scrollMenu(this_00,direction,true,true);
      break;
    }
LAB_0045dad8:
    SVar38 = ScrollTop;
LAB_0045dae0:
    QMenuPrivate::scrollMenu(this_00,SVar38,true);
    break;
  case 0x1000017:
switchD_0045d7cc_caseD_1000017:
    if ((this_00->currentAction == (QAction *)0x0) || (this_00->scroll == (QMenuScroller *)0x0))
    break;
    if ((this_00->scroll->scrollFlags & 2) != 0) {
      direction = ScrollDown;
      goto LAB_0045e46e;
    }
LAB_0045daa6:
    SVar38 = ScrollBottom;
    goto LAB_0045dae0;
  default:
switchD_0045d7cc_default:
    if (iVar27 == 0x20) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar27 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0xf,0,this,0);
      if (iVar27 != 0) goto switchD_0045d7cc_caseD_1000004;
    }
switchD_0045d7cc_caseD_1000003:
    iVar27 = 0x46;
    cVar23 = QKeyEvent::matches((StandardKey)e);
    if (cVar23 == '\0') {
      iVar27 = QKeyEvent::modifiers();
      if (iVar27 < 0x8000000) {
        if ((iVar27 == 0) || (iVar27 == 0x2000000)) goto LAB_0045dede;
      }
      else if ((iVar27 == 0x8000000) || ((iVar27 == 0x28000000 || (iVar27 == 0x20000000)))) {
LAB_0045dede:
        pQVar16 = *(QArrayData **)(e + 0x28);
        lVar32 = *(long *)(e + 0x38);
        if (pQVar16 != (QArrayData *)0x0) {
          LOCK();
          (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar16,2,0x10);
          }
        }
        if (lVar32 == 1) {
          pQVar31 = QWidget::style(&this->super_QWidget);
          iVar27 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x42,0,this,0);
          if ((iVar27 == 0) || (iVar27 = QKeyEvent::modifiers(), iVar27 != 0)) {
            pQVar16 = *(QArrayData **)(e + 0x28);
            puVar17 = *(ushort **)(e + 0x30);
            if (pQVar16 == (QArrayData *)0x0) {
              sVar24 = QChar::toUpper((uint)*puVar17);
            }
            else {
              LOCK();
              (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              sVar24 = QChar::toUpper((uint)*puVar17);
              LOCK();
              (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar16,2,0x10);
              }
            }
            if ((this_00->super_QWidgetPrivate).actions.d.size != 0) {
              uVar42 = 0;
              lVar32 = 8;
              local_90 = (QAction *)0x0;
              local_70 = (QAction *)0x0;
              pQVar33 = (QAction *)0x0;
              local_7c = 0;
              do {
                pQVar19 = (this_00->actionRects).d.ptr;
                uVar7 = *(undefined8 *)((long)pQVar19 + lVar32 + -8);
                uVar8 = *(undefined8 *)((long)&(pQVar19->x1).m_i + lVar32);
                iVar27 = -(uint)((int)uVar8 == (int)uVar7 + -1);
                iVar53 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
                auVar49._4_4_ = iVar27;
                auVar49._0_4_ = iVar27;
                auVar49._8_4_ = iVar53;
                auVar49._12_4_ = iVar53;
                iVar27 = movmskpd((int)pQVar19,auVar49);
                if (iVar27 != 3) {
                  pQVar41 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar42];
                  cVar23 = QAction::isEnabled();
                  if ((cVar23 != '\0') && (cVar23 = QAction::isSeparator(), cVar23 == '\0')) {
                    local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    QAction::text();
                    QKeySequence::mnemonic((QString *)&local_48);
                    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_68._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                      }
                    }
                    sVar25 = QKeySequence::operator[]((uint)&local_48);
                    pQVar22 = local_70;
                    if (sVar24 == sVar25) {
                      local_7c = local_7c + 1;
                      if (pQVar33 == (QAction *)0x0) {
                        pQVar33 = pQVar41;
                      }
                      pQVar22 = pQVar41;
                      if (pQVar41 != this_00->currentAction) {
                        if (local_70 == (QAction *)0x0) {
                          pQVar41 = local_90;
                        }
                        pQVar22 = local_70;
                        if (local_90 == (QAction *)0x0) {
                          local_90 = pQVar41;
                        }
                      }
                    }
                    local_70 = pQVar22;
                    QKeySequence::~QKeySequence((QKeySequence *)&local_48);
                  }
                }
                uVar42 = uVar42 + 1;
                lVar32 = lVar32 + 0x10;
              } while (uVar42 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
              if (0 < local_7c) {
                if (local_90 == (QAction *)0x0) {
                  local_90 = pQVar33;
                }
                if (local_70 == (QAction *)0x0) {
                  local_90 = pQVar33;
                }
                bVar44 = local_7c != 1;
                if (!bVar44) {
                  local_90 = pQVar33;
                }
                goto LAB_0045e646;
              }
            }
          }
          else {
            QBasicTimer::start(&this_00->searchBufferTimer,2000000000,1,this);
            piVar20 = *(int **)(e + 0x28);
            local_68 = *(undefined1 (*) [16])(e + 0x28);
            local_58 = *(undefined1 **)(e + 0x38);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + 1;
              UNLOCK();
            }
            QString::append((QString *)&this_00->searchBuffer);
            if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
              }
            }
            uVar42 = (this_00->super_QWidgetPrivate).actions.d.size;
            if (uVar42 != 0) {
              uVar37 = 0;
              iVar27 = 0;
              local_90 = (QAction *)0x0;
              do {
                pQVar19 = (this_00->actionRects).d.ptr;
                uVar5 = pQVar19[uVar37].x1;
                uVar13 = pQVar19[uVar37].y1;
                uVar6 = pQVar19[uVar37].x2;
                uVar14 = pQVar19[uVar37].y2;
                iVar53 = -(uint)(uVar6 == uVar5 + -1);
                iVar54 = -(uint)(uVar14 == uVar13 + -1);
                auVar50._4_4_ = iVar53;
                auVar50._0_4_ = iVar53;
                auVar50._8_4_ = iVar54;
                auVar50._12_4_ = iVar54;
                iVar53 = movmskpd((int)pQVar19,auVar50);
                if (iVar53 != 3) {
                  pQVar33 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar37];
                  local_58 = &DAT_aaaaaaaaaaaaaaaa;
                  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  QAction::text();
                  if ((this_00->searchBuffer).d.size == 0) {
                    iVar53 = 0;
                  }
                  else {
                    uVar42 = 0;
                    iVar53 = 0;
                    do {
                      local_48.m_size = (qsizetype)local_58;
                      local_48.m_data = (storage_type_conflict *)local_68._8_8_;
                      qVar34 = QStringView::indexOf
                                         (&local_48,(QChar)(this_00->searchBuffer).d.ptr[uVar42],0,
                                          CaseInsensitive);
                      iVar53 = iVar53 + (uint)(qVar34 != -1);
                      uVar42 = uVar42 + 1;
                    } while (uVar42 < (ulong)(this_00->searchBuffer).d.size);
                  }
                  if (iVar27 < iVar53) {
                    iVar27 = iVar53;
                    local_90 = pQVar33;
                  }
                  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                    }
                  }
                  uVar42 = (this_00->super_QWidgetPrivate).actions.d.size;
                }
                uVar37 = uVar37 + 1;
              } while (uVar37 < uVar42);
              bVar44 = true;
LAB_0045e646:
              if (local_90 != (QAction *)0x0) {
                if (this_00->scroll != (QMenuScroller *)0x0) {
                  QMenuPrivate::scrollMenu(this_00,local_90,ScrollCenter,false);
                }
                QMenuPrivate::setCurrentAction(this_00,local_90,0,SelectedFromElsewhere,true);
                QAction::menuObject();
                lVar32 = QMetaObject::cast((QObject *)&staticMetaObject);
                if (lVar32 == 0 && !bVar44) {
                  QMenuPrivate::setSyncAction(this_00);
LAB_0045ddc3:
                  QMenuPrivate::activateAction(this_00,local_90,Trigger,true);
                }
                break;
              }
            }
          }
        }
      }
      QMenuPrivate::topCausedWidget(this_00);
      pQVar35 = (QObject *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if (pQVar35 != (QObject *)0x0) {
        lVar32 = *(long *)(*(long *)(pQVar35 + 8) + 0x288);
        if ((lVar32 == 0) || (*(int *)(lVar32 + 4) == 0)) {
          lVar32 = 0;
        }
        else {
          lVar32 = *(long *)(*(long *)(pQVar35 + 8) + 0x290);
        }
        QCoreApplication::sendEvent(pQVar35,(QEvent *)e);
        lVar36 = *(long *)(*(long *)(pQVar35 + 8) + 0x288);
        if ((lVar36 == 0) || (*(int *)(lVar36 + 4) == 0)) {
          lVar36 = 0;
        }
        else {
          lVar36 = *(long *)(*(long *)(pQVar35 + 8) + 0x290);
        }
        if (lVar36 != lVar32) break;
      }
      e[0xc] = (QKeyEvent)0x0;
      goto LAB_0045e739;
    }
    if ((this_00->field_0x421 & 4) != 0) {
      QWidget::close(&this->super_QWidget,iVar27);
      goto LAB_0045e739;
    }
    pDVar40 = (this_00->causedPopup).widget.wp.d;
    if (pDVar40 == (Data *)0x0) {
      QMenuPrivate::hideMenu(this_00,this);
    }
    else {
      LOCK();
      *(int *)pDVar40 = *(int *)pDVar40 + 1;
      UNLOCK();
      QMenuPrivate::hideMenu(this_00,this);
    }
    lVar32 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar32 != 0) {
      QMenuBarPrivate::setCurrentAction
                (*(QMenuBarPrivate **)(lVar32 + 8),this_00->menuAction,false,false);
      QMenuBarPrivate::setKeyboardMode(*(QMenuBarPrivate **)(lVar32 + 8),true);
    }
    if (pDVar40 != (Data *)0x0) {
LAB_0045e20c:
      LOCK();
      *(int *)pDVar40 = *(int *)pDVar40 + -1;
      UNLOCK();
      if (*(int *)pDVar40 == 0) {
        operator_delete(pDVar40);
      }
    }
  }
  goto LAB_0045e730;
  while( true ) {
    uVar28 = iVar53 - 1;
    uVar37 = (ulong)uVar28;
    pQVar33 = (this_00->super_QWidgetPrivate).actions.d.ptr[(int)uVar28];
    if (pQVar33 == this_00->currentAction) goto LAB_0045dd9d;
    pQVar19 = (this_00->actionRects).d.ptr;
    uVar1 = pQVar19[(int)uVar28].x1;
    uVar9 = pQVar19[(int)uVar28].y1;
    uVar2 = pQVar19[(int)uVar28].x2;
    uVar10 = pQVar19[(int)uVar28].y2;
    iVar53 = -(uint)(uVar2 == uVar1 + -1);
    iVar54 = -(uint)(uVar10 == uVar9 + -1);
    auVar47._4_4_ = iVar53;
    auVar47._0_4_ = iVar53;
    auVar47._8_4_ = iVar54;
    auVar47._12_4_ = iVar54;
    iVar53 = movmskpd((int)pQVar19,auVar47);
    if ((iVar53 != 3) && (bVar44 = QMenuPrivate::considerAction(this_00,pQVar33), bVar44)) break;
LAB_0045dc43:
    iVar53 = (int)uVar37;
    if (iVar53 == 0) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar53 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x49,0,this);
      if (iVar53 == 0) goto LAB_0045dd9d;
      if (this_00->scroll != (QMenuScroller *)0x0) {
        SVar38 = ScrollBottom;
      }
      iVar53 = (int)(this_00->actionRects).d.size;
    }
  }
  if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 1) != 0)) {
    pQVar15 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
    pQVar31 = QWidget::style(pQVar15);
    iVar53 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar15);
    if ((this_00->field_0x421 & 2) != 0) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar54 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1f,0,this);
      iVar53 = iVar53 + iVar54;
    }
    pQVar19 = (this_00->actionRects).d.ptr;
    if ((iVar27 - iVar53) + this_00->scroll->scrollOffset <=
        (pQVar19[(int)uVar28].y2.m_i - pQVar19[(int)uVar28].y1.m_i) + 1) {
      SVar38 = ScrollTop;
    }
  }
  if (pQVar33 != (QAction *)0x0) goto LAB_0045e236;
LAB_0045dd9d:
  if ((*(uint *)&this_00->field_0x420 >> 9 & 1) != 0) {
    *(ushort *)&this_00->field_0x420 = (ushort)*(uint *)&this_00->field_0x420 | 0x800;
  }
  goto LAB_0045e730;
LAB_0045e224:
  SVar38 = ScrollStay;
  goto LAB_0045e22d;
  while( true ) {
    iVar29 = (int)uVar37;
    pQVar33 = (this_00->super_QWidgetPrivate).actions.d.ptr[iVar29];
    if (pQVar33 == this_00->currentAction) goto LAB_0045e730;
    pQVar19 = (this_00->actionRects).d.ptr;
    uVar3 = pQVar19[iVar29].x1;
    uVar11 = pQVar19[iVar29].y1;
    uVar4 = pQVar19[iVar29].x2;
    uVar12 = pQVar19[iVar29].y2;
    iVar51 = -(uint)(uVar4 == uVar3 + -1);
    iVar52 = -(uint)(uVar12 == uVar11 + -1);
    auVar48._4_4_ = iVar51;
    auVar48._0_4_ = iVar51;
    auVar48._8_4_ = iVar52;
    auVar48._12_4_ = iVar52;
    iVar51 = movmskpd((int)pQVar19,auVar48);
    if ((iVar51 != 3) && (bVar44 = QMenuPrivate::considerAction(this_00,pQVar33), bVar44)) break;
LAB_0045e015:
    uVar28 = (int)uVar37 + 1;
    uVar37 = (ulong)uVar28;
    if ((this_00->actionRects).d.size == (long)(int)uVar28) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar29 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x49,0,this);
      if (iVar29 == 0) goto LAB_0045e730;
      if (this_00->scroll != (QMenuScroller *)0x0) {
        SVar38 = ScrollTop;
      }
      uVar37 = 0;
    }
  }
  if ((this_00->scroll != (QMenuScroller *)0x0) && ((this_00->scroll->scrollFlags & 2) != 0)) {
    pQVar18 = (this->super_QWidget).data;
    iVar51 = (pQVar18->crect).y1.m_i;
    iVar52 = (pQVar18->crect).y2.m_i;
    pQVar15 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
    pQVar31 = QWidget::style(pQVar15);
    iVar30 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar15);
    iVar51 = (iVar52 - (iVar30 + iVar51)) + 1;
    if ((this_00->scroll->scrollFlags & 1) != 0) {
      pQVar15 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      pQVar31 = QWidget::style(pQVar15);
      iVar52 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar15);
      iVar51 = iVar51 - iVar52;
    }
    if ((this_00->field_0x421 & 2) != 0) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar52 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1f,0,this);
      iVar51 = iVar51 - iVar52;
    }
    pQVar19 = (this_00->actionRects).d.ptr;
    if (iVar51 < ((((iVar27 + iVar53) - iVar54) + this_00->scroll->scrollOffset +
                  pQVar19[iVar29].y2.m_i) - pQVar19[iVar29].y1.m_i) + 2) {
      SVar38 = ScrollBottom;
    }
  }
LAB_0045e22d:
  if (pQVar33 != (QAction *)0x0) {
LAB_0045e236:
    if ((this_00->scroll != (QMenuScroller *)0x0) && (SVar38 != ScrollStay)) {
      QBasicTimer::stop();
      QMenuPrivate::scrollMenu(this_00,pQVar33,SVar38,false);
    }
LAB_0045e448:
    QMenuPrivate::setCurrentAction(this_00,pQVar33,-1,SelectedFromKeyboard,false);
  }
LAB_0045e730:
  e[0xc] = (QKeyEvent)0x1;
LAB_0045e739:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
#ifndef Q_OS_MAC
    if (key == Qt::Key_Tab) //means down
        key = Qt::Key_Down;
    if (key == Qt::Key_Backtab) //means up
        key = Qt::Key_Up;
#endif

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Home:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        break;
    case Qt::Key_End:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        break;
    case Qt::Key_PageUp:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollUp, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        }
        break;
    case Qt::Key_PageDown:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollDown, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        }
        break;
    case Qt::Key_Up:
    case Qt::Key_Down: {
        key_consumed = true;
        QAction *nextAction = nullptr;
        QMenuPrivate::QMenuScroller::ScrollLocation scroll_loc = QMenuPrivate::QMenuScroller::ScrollStay;
        if (!d->currentAction) {
            if (key == Qt::Key_Down) {
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            } else {
                for(int i = d->actions.size()-1; i >= 0; --i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            }
        } else {
            for(int i = 0, y = 0; !nextAction && i < d->actions.size(); i++) {
                QAction *act = d->actions.at(i);
                if (act == d->currentAction) {
                    if (key == Qt::Key_Up) {
                        for(int next_i = i-1; true; next_i--) {
                            if (next_i == -1) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                                next_i = d->actionRects.size()-1;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)) {
                                int topVisible = d->scrollerHeight();
                                if (d->tearoff)
                                    topVisible += style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if (((y + d->scroll->scrollOffset) - topVisible) <= d->actionRects.at(next_i).height())
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                            }
                            break;
                        }
                        if (!nextAction && d->tearoff)
                            d->tearoffHighlighted = 1;
                    } else {
                        y += d->actionRects.at(i).height();
                        for(int next_i = i+1; true; next_i++) {
                            if (next_i == d->actionRects.size()) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                                next_i = 0;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)) {
                                int bottomVisible = height() - d->scrollerHeight();
                                if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                                    bottomVisible -= d->scrollerHeight();
                                if (d->tearoff)
                                    bottomVisible -= style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if ((y + d->scroll->scrollOffset + d->actionRects.at(next_i).height()) > bottomVisible)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                            }
                            break;
                        }
                    }
                    break;
                }
                y += d->actionRects.at(i).height();
            }
        }
        if (nextAction) {
            if (d->scroll && scroll_loc != QMenuPrivate::QMenuScroller::ScrollStay) {
                d->scroll->scrollTimer.stop();
                d->scrollMenu(nextAction, scroll_loc);
            }
            d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
        }
        break; }

    case Qt::Key_Right:
        if (d->currentAction && d->currentAction->isEnabled() && d->currentAction->menu()) {
            d->popupAction(d->currentAction, 0, true);
            key_consumed = true;
            break;
        }
        Q_FALLTHROUGH();
    case Qt::Key_Left: {
        if (d->currentAction && !d->scroll) {
            QAction *nextAction = nullptr;
            if (key == Qt::Key_Left) {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.left()-1; !nextAction && x >= 0; x--)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            } else {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.right()+1; !nextAction && x < width(); x++)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            }
            if (nextAction) {
                d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                key_consumed = true;
            }
        }
        if (!key_consumed && key == Qt::Key_Left && qobject_cast<QMenu*>(d->causedPopup.widget)) {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this);
            if (caused)
                caused->setFocus();
            key_consumed = true;
        }
        break; }

    case Qt::Key_Alt:
        if (d->tornoff)
            break;

        key_consumed = true;
        if (style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this))
        {
            d->hideMenu(this);
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(QApplication::focusWidget())) {
                mb->d_func()->setKeyboardMode(false);
            }
#endif
        }
        break;

    case Qt::Key_Space:
        if (!style()->styleHint(QStyle::SH_Menu_SpaceActivatesItem, nullptr, this))
            break;
        // for motif, fall through
        Q_FALLTHROUGH();
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
#endif
    case Qt::Key_Return:
    case Qt::Key_Enter: {
        if (!d->currentAction) {
            d->setFirstActionActive();
            key_consumed = true;
            break;
        }

        d->setSyncAction();

        if (d->currentAction->menu())
            d->popupAction(d->currentAction, 0, true);
        else
            d->activateAction(d->currentAction, QAction::Trigger);
        key_consumed = true;
        break; }

#if QT_CONFIG(whatsthis)
    case Qt::Key_F1:
        if (!d->currentAction || d->currentAction->whatsThis().isNull())
            break;
        QWhatsThis::enterWhatsThisMode();
        d->activateAction(d->currentAction, QAction::Trigger);
        return;
#endif
    default:
        key_consumed = false;
    }

    if (!key_consumed && (
        false
#ifndef QT_NO_SHORTCUT
        || e->matches(QKeySequence::Cancel)
#endif
#ifdef QT_KEYPAD_NAVIGATION
        || e->key() == Qt::Key_Back
#endif
    )) {
        key_consumed = true;
        if (d->tornoff) {
            close();
            return;
        }
        {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this); // hide after getting causedPopup
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(d->menuAction);
                mb->d_func()->setKeyboardMode(true);
            }
#endif
        }
    }

    if (!key_consumed) {                                // send to menu bar
        const Qt::KeyboardModifiers modifiers = e->modifiers();
        if ((!modifiers || modifiers == Qt::AltModifier || modifiers == Qt::ShiftModifier
             || modifiers == Qt::KeypadModifier
             || modifiers == (Qt::KeypadModifier | Qt::AltModifier))
            && e->text().size() == 1) {
            bool activateAction = false;
            QAction *nextAction = nullptr;
            if (style()->styleHint(QStyle::SH_Menu_KeyboardSearch, nullptr, this) && !e->modifiers()) {
                int best_match_count = 0;
                d->searchBufferTimer.start(2000, this);
                d->searchBuffer += e->text();
                for(int i = 0; i < d->actions.size(); ++i) {
                    int match_count = 0;
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    const QString act_text = act->text();
                    for(int c = 0; c < d->searchBuffer.size(); ++c) {
                        if (act_text.indexOf(d->searchBuffer.at(c), 0, Qt::CaseInsensitive) != -1)
                            ++match_count;
                    }
                    if (match_count > best_match_count) {
                        best_match_count = match_count;
                        nextAction = act;
                    }
                }
            }
#ifndef QT_NO_SHORTCUT
            else {
                int clashCount = 0;
                QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
                QChar c = e->text().at(0).toUpper();
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (!act->isEnabled() || act->isSeparator())
                        continue;
                    QKeySequence sequence = QKeySequence::mnemonic(act->text());
                    int key = sequence[0].toCombined() & 0xffff; // suspicious
                    if (key == c.unicode()) {
                        clashCount++;
                        if (!first)
                            first = act;
                        if (act == d->currentAction)
                            currentSelected = act;
                        else if (!firstAfterCurrent && currentSelected)
                            firstAfterCurrent = act;
                    }
                }
                if (clashCount == 1)
                    activateAction = true;
                if (clashCount >= 1) {
                    if (clashCount == 1 || !currentSelected || !firstAfterCurrent)
                        nextAction = first;
                    else
                        nextAction = firstAfterCurrent;
                }
            }
#endif
            if (nextAction) {
                key_consumed = true;
                if (d->scroll)
                    d->scrollMenu(nextAction, QMenuPrivate::QMenuScroller::ScrollCenter, false);
                d->setCurrentAction(nextAction, 0, QMenuPrivate::SelectedFromElsewhere, true);
                if (!nextAction->menu() && activateAction) {
                    d->setSyncAction();
                    d->activateAction(nextAction, QAction::Trigger);
                }
            }
        }
        if (!key_consumed) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->topCausedWidget())) {
                QAction *oldAct = mb->d_func()->currentAction;
                QCoreApplication::sendEvent(mb, e);
                if (mb->d_func()->currentAction != oldAct)
                    key_consumed = true;
            }
#endif
        }

#ifdef Q_OS_WIN32
        if (key_consumed && (e->key() == Qt::Key_Control || e->key() == Qt::Key_Shift || e->key() == Qt::Key_Meta))
            QApplication::beep();
#endif // Q_OS_WIN32
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}